

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_densePOTRS(sunrealtype **a,sunindextype m,sunrealtype *b)

{
  sunrealtype *psVar1;
  sunindextype j;
  sunindextype i;
  sunrealtype *col_i;
  sunrealtype *col_j;
  sunrealtype *b_local;
  sunindextype m_local;
  sunrealtype **a_local;
  
  for (j = 0; j < m + -1; j = j + 1) {
    psVar1 = a[j];
    b[j] = b[j] / psVar1[j];
    i = j;
    while (i = i + 1, i < m) {
      b[i] = -b[j] * psVar1[i] + b[i];
    }
  }
  b[m + -1] = b[m + -1] / a[m + -1][m + -1];
  b[m + -1] = b[m + -1] / a[m + -1][m + -1];
  for (i = m + -2; -1 < i; i = i + -1) {
    psVar1 = a[i];
    j = i;
    while (j = j + 1, j < m) {
      b[i] = -psVar1[j] * b[j] + b[i];
    }
    b[i] = b[i] / psVar1[i];
  }
  return;
}

Assistant:

void SUNDlsMat_densePOTRS(sunrealtype** a, sunindextype m, sunrealtype* b)
{
  sunrealtype *col_j, *col_i;
  sunindextype i, j;

  /* Solve C y = b, forward substitution - column version.
     Store solution y in b */
  for (j = 0; j < m - 1; j++)
  {
    col_j = a[j];
    b[j] /= col_j[j];
    for (i = j + 1; i < m; i++) { b[i] -= b[j] * col_j[i]; }
  }
  col_j = a[m - 1];
  b[m - 1] /= col_j[m - 1];

  /* Solve C^T x = y, backward substitution - row version.
     Store solution x in b */
  col_j = a[m - 1];
  b[m - 1] /= col_j[m - 1];
  for (i = m - 2; i >= 0; i--)
  {
    col_i = a[i];
    for (j = i + 1; j < m; j++) { b[i] -= col_i[j] * b[j]; }
    b[i] /= col_i[i];
  }
}